

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O1

fft_plan *
sptk::world::fft_plan_dft_r2c_1d
          (fft_plan *__return_storage_ptr__,int n,double *in,fft_complex *out,uint flags)

{
  double *pdVar1;
  int *ip;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar2 = n * 5 + 3;
  if (-1 < n * 5) {
    iVar2 = n * 5;
  }
  uVar5 = (long)(iVar2 >> 2) << 3;
  if (n < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  uVar4 = (long)n * 4;
  if (n < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar3 = (long)n << 3;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->sign = 0;
  *(undefined8 *)&__return_storage_ptr__->flags = 0;
  __return_storage_ptr__->c_in = (fft_complex *)0x0;
  __return_storage_ptr__->in = (double *)0x0;
  __return_storage_ptr__->c_out = (fft_complex *)0x0;
  __return_storage_ptr__->out = (double *)0x0;
  if (n < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __return_storage_ptr__->w = (double *)0x0;
  __return_storage_ptr__->input = (double *)0x0;
  __return_storage_ptr__->ip = (int *)0x0;
  __return_storage_ptr__->n = n;
  __return_storage_ptr__->in = in;
  __return_storage_ptr__->c_in = (fft_complex *)0x0;
  __return_storage_ptr__->out = (double *)0x0;
  __return_storage_ptr__->c_out = out;
  __return_storage_ptr__->sign = 1;
  __return_storage_ptr__->flags = flags;
  pdVar1 = (double *)operator_new__(uVar3);
  __return_storage_ptr__->input = pdVar1;
  ip = (int *)operator_new__(uVar4);
  __return_storage_ptr__->ip = ip;
  pdVar1 = (double *)operator_new__(uVar5);
  __return_storage_ptr__->w = pdVar1;
  *ip = 0;
  iVar2 = n >> 2;
  makewt(iVar2,ip,pdVar1);
  makect(iVar2,ip,pdVar1 + iVar2);
  return __return_storage_ptr__;
}

Assistant:

fft_plan fft_plan_dft_r2c_1d(int n, double *in, fft_complex *out,
    unsigned int flags) {
#if 0
  void makewt(int nw, int *ip, double *w);
  void makect(int nc, int *ip, double *c);
#endif

  fft_plan output = {0};
  output.n = n;
  output.in = in;
  output.c_in = NULL;
  output.out = NULL;
  output.c_out = out;
  output.sign = FFT_FORWARD;
  output.flags = flags;
  output.input = new double[n];
  output.ip = new int[n];
  output.w = new double[n * 5 / 4];

  output.ip[0] = 0;
  makewt(output.n >> 2, output.ip, output.w);
  makect(output.n >> 2, output.ip, output.w + (output.n >> 2));
  return output;
}